

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

void __thiscall icu_63::Calendar::set(Calendar *this,UCalendarDateFields field,int32_t value)

{
  int iVar1;
  UErrorCode ec;
  
  if (this->fAreFieldsVirtuallySet != '\0') {
    (*(this->super_UObject)._vptr_UObject[0x1d])(this);
  }
  this->fFields[field] = value;
  if (this->fNextStamp == 10000) {
    recalculateStamp(this);
  }
  iVar1 = this->fNextStamp;
  this->fNextStamp = iVar1 + 1;
  this->fStamp[field] = iVar1;
  this->fIsSet[field] = '\x01';
  this->fAreFieldsVirtuallySet = '\0';
  this->fIsTimeSet = '\0';
  this->fAreFieldsSet = '\0';
  return;
}

Assistant:

void
Calendar::set(UCalendarDateFields field, int32_t value)
{
    if (fAreFieldsVirtuallySet) {
        UErrorCode ec = U_ZERO_ERROR;
        computeFields(ec);
    }
    fFields[field]     = value;
    /* Ensure that the fNextStamp value doesn't go pass max value for int32_t */
    if (fNextStamp == STAMP_MAX) {
        recalculateStamp();
    }
    fStamp[field]     = fNextStamp++;
    fIsSet[field]     = TRUE; // Remove later
    fIsTimeSet = fAreFieldsSet = fAreFieldsVirtuallySet = FALSE;
}